

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O3

void HighsHashHelpers::sparse_combine(u64 *hash,HighsInt index)

{
  u64 uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = modexp_M61(*(ulong *)(&DAT_003d1f30 + (ulong)(index & 0x3f) * 8) & 0x1fffffffffffffff,
                     ((ulong)(long)index >> 6) + 1);
  uVar2 = (uVar1 + *hash & 0x1fffffffffffffff) + (uVar1 + *hash >> 0x3d);
  uVar3 = uVar2 + 0xe000000000000001;
  if (uVar2 < 0x1fffffffffffffff) {
    uVar3 = uVar2;
  }
  *hash = uVar3;
  return;
}

Assistant:

static void sparse_combine(u64& hash, HighsInt index) {
    u64 a = c[index & 63] & M61();
    u64 degree = (static_cast<u64>(index) >> 6) + 1;

    hash += modexp_M61(a, degree);
    hash = (hash >> 61) + (hash & M61());
    if (hash >= M61()) hash -= M61();
    assert(hash < M61());
  }